

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimersRegistry.cpp
# Opt level: O1

void __thiscall TimersRegistry::TraceAll(TimersRegistry *this)

{
  _Rb_tree_node_base *this_00;
  Trace *pTVar1;
  _Rb_tree_node_base *p_Var2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  p_Var2 = (this->mTimers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pTVar1 = Trace::DefaultTrace();
  Trace::TraceToLog(pTVar1,"Start Tracing Timers");
  for (; (_Rb_tree_header *)p_Var2 != &(this->mTimers)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    this_00 = p_Var2 + 2;
    dVar3 = Timer::GetTotalMiliSeconds((Timer *)this_00);
    dVar4 = Timer::GetTotalMiliSeconds((Timer *)this_00);
    dVar5 = Timer::GetTotalMiliSeconds((Timer *)this_00);
    dVar6 = Timer::GetTotalMiliSeconds((Timer *)this_00);
    pTVar1 = Trace::DefaultTrace();
    Trace::TraceToLog(pTVar1,"Tracing Timer %s. total time [h:m:s:ms] = %ld:%ld:%ld:%ld",
                      *(undefined8 *)(p_Var2 + 1),(long)dVar3 / 3600000,
                      ((long)dVar4 % 3600000) / 60000,((long)dVar5 % 60000) / 1000,
                      (long)dVar6 % 1000);
  }
  pTVar1 = Trace::DefaultTrace();
  Trace::TraceToLog(pTVar1,"End Tracing Timers");
  return;
}

Assistant:

void TimersRegistry::TraceAll()
{
	StringToTimerMap::iterator it = mTimers.begin();
	
	TRACE_LOG("Start Tracing Timers");
	for(; it != mTimers.end(); ++it)
	{
		long hours = (long)it->second.GetTotalMiliSeconds()/3600000;
		long minutes = ((long)it->second.GetTotalMiliSeconds()%3600000) / 60000;
		long seconds = ((long)it->second.GetTotalMiliSeconds()%60000) / 1000;
		long miliseconds = (long)it->second.GetTotalMiliSeconds()%1000;
		TRACE_LOG5("Tracing Timer %s. total time [h:m:s:ms] = %ld:%ld:%ld:%ld",
						it->first.c_str(),hours,minutes,seconds,miliseconds);
	}
	TRACE_LOG("End Tracing Timers");
}